

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageView::removeWidget(PageView *this,QWidget *widget)

{
  PageControl *this_00;
  int iVar1;
  int iVar2;
  PageViewPrivate *pPVar3;
  qsizetype qVar4;
  bool changePage;
  int index;
  QWidget *widget_local;
  PageView *this_local;
  
  iVar1 = indexOf(this,widget);
  if (iVar1 != -1) {
    pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    QList<QWidget_*>::removeAt(&pPVar3->pages,(long)iVar1);
    QWidget::setParent(widget);
    QWidget::hide();
    iVar2 = currentIndex(this);
    pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    this_00 = pPVar3->control;
    pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    qVar4 = QList<QWidget_*>::count(&pPVar3->pages);
    PageControl::setCount(this_00,(int)qVar4);
    if ((iVar1 == iVar2) && (iVar1 = currentIndex(this), iVar1 != -1)) {
      pPVar3 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
               ::operator->(&this->d);
      iVar1 = currentIndex(this);
      PageViewPrivate::showPage(pPVar3,iVar1);
    }
  }
  return;
}

Assistant:

void
PageView::removeWidget( QWidget * widget )
{
	const int index  = indexOf( widget );

	if( index != -1 )
	{
		d->pages.removeAt( index );

		widget->setParent( 0 );

		widget->hide();

		const bool changePage = index == currentIndex();

		d->control->setCount( d->pages.count() );

		if( changePage && currentIndex() != -1 )
			d->showPage( currentIndex() );
	}
}